

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source.h
# Opt level: O1

string * __thiscall
trieste::Location::origin_linecol_abi_cxx11_(string *__return_storage_ptr__,Location *this)

{
  SourceDef *this_00;
  element_type *peVar1;
  ostream *poVar2;
  stringstream ss;
  stringstream asStack_1a8 [16];
  undefined1 local_198 [376];
  
  std::__cxx11::stringstream::stringstream(asStack_1a8);
  this_00 = (this->source).super___shared_ptr<trieste::SourceDef,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  if ((this_00 != (SourceDef *)0x0) && ((this_00->origin_)._M_string_length != 0)) {
    SourceDef::linecol(this_00,this->pos);
    peVar1 = (this->source).super___shared_ptr<trieste::SourceDef,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_198,(peVar1->origin_)._M_dataplus._M_p,
                        (peVar1->origin_)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,":",1);
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,":",1);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_1a8);
  std::ios_base::~ios_base((ios_base *)(local_198 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

std::string origin_linecol() const
    {
      std::stringstream ss;

      if (source && !source->origin().empty())
      {
        auto [line, col] = linecol();
        ss << source->origin() << ":" << (line + 1) << ":" << (col + 1);
      }

      return ss.str();
    }